

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minmax_n_helpers.hpp
# Opt level: O1

void __thiscall
duckdb::UnaryAggregateHeap<int,_duckdb::GreaterThan>::Insert
          (UnaryAggregateHeap<int,_duckdb::GreaterThan> *this,ArenaAllocator *allocator,int *value)

{
  HeapEntry<int> *pHVar1;
  bool bVar2;
  ulong uVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  
  pHVar1 = this->heap;
  uVar3 = this->size;
  if (uVar3 < this->capacity) {
    this->size = uVar3 + 1;
    pHVar1[uVar3].value = *value;
    iVar4 = pHVar1[uVar3].value;
    uVar7 = uVar3;
    if (1 < (long)(uVar3 + 1)) {
      do {
        uVar6 = (long)((uVar3 - ((long)(uVar3 - 1) >> 0x3f)) + -1) >> 1;
        uVar7 = uVar3;
        if (pHVar1[uVar6].value <= iVar4) break;
        pHVar1[uVar3].value = pHVar1[uVar6].value;
        bVar2 = 2 < (long)uVar3;
        uVar3 = uVar6;
        uVar7 = uVar6;
      } while (bVar2);
    }
  }
  else {
    if (*value <= pHVar1->value) {
      return;
    }
    if (1 < (long)uVar3) {
      uVar7 = uVar3 * 4 - 4;
      iVar4 = pHVar1[uVar3 - 1].value;
      pHVar1[uVar3 - 1].value = pHVar1->value;
      lVar9 = (long)uVar7 >> 2;
      if (lVar9 < 3) {
        lVar8 = 0;
      }
      else {
        lVar5 = 0;
        do {
          if (pHVar1[lVar5 * 2 + 1].value < pHVar1[lVar5 * 2 + 2].value) {
            lVar8 = lVar5 * 2 + 1;
          }
          else {
            lVar8 = lVar5 * 2 + 2;
          }
          pHVar1[lVar5].value = pHVar1[lVar8].value;
          lVar5 = lVar8;
        } while (lVar8 < (lVar9 - (lVar9 + -1 >> 0x3f)) + -1 >> 1);
      }
      if (((uVar7 & 4) == 0) && (lVar8 == lVar9 + -2 >> 1)) {
        pHVar1[lVar8].value = pHVar1[lVar8 * 2 + 1].value;
        lVar8 = lVar8 * 2 + 1;
      }
      if (0 < lVar8) {
        do {
          lVar9 = (lVar8 - (lVar8 + -1 >> 0x3f)) + -1 >> 1;
          if (pHVar1[lVar9].value <= iVar4) break;
          pHVar1[lVar8].value = pHVar1[lVar9].value;
          bVar2 = 2 < lVar8;
          lVar8 = lVar9;
        } while (bVar2);
      }
      pHVar1[lVar8].value = iVar4;
    }
    iVar4 = *value;
    pHVar1[uVar3 - 1].value = iVar4;
    uVar7 = uVar3 - 1;
    if (1 < (long)uVar3) {
      do {
        uVar3 = (long)((uVar7 - ((long)(uVar7 - 1) >> 0x3f)) + -1) >> 1;
        if (pHVar1[uVar3].value <= iVar4) break;
        pHVar1[uVar7].value = pHVar1[uVar3].value;
        bVar2 = 2 < (long)uVar7;
        uVar7 = uVar3;
      } while (bVar2);
    }
  }
  pHVar1[uVar7].value = iVar4;
  return;
}

Assistant:

void Insert(ArenaAllocator &allocator, const T &value) {
		D_ASSERT(capacity != 0); // must be initialized

		// If the heap is not full, insert the value into a new slot
		if (size < capacity) {
			heap[size++].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		// If the heap is full, check if the value is greater than the smallest value in the heap
		// If it is, assign the new value to the slot and re-heapify
		else if (T_COMPARATOR::Operation(value, heap[0].value)) {
			std::pop_heap(heap, heap + size, Compare);
			heap[size - 1].Assign(allocator, value);
			std::push_heap(heap, heap + size, Compare);
		}
		D_ASSERT(std::is_heap(heap, heap + size, Compare));
	}